

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

void Abc_FrameReplaceCurrentNetwork(Abc_Frame_t *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Ntk_t *pNetBackup;
  Abc_Ntk_t *pNtk_local;
  Abc_Frame_t *p_local;
  
  if (pNtk != (Abc_Ntk_t *)0x0) {
    iVar1 = Abc_NtkPoNum(pNtk);
    if (iVar1 == 0) {
      Abc_Print(0,
                "The current network has no primary outputs. Some commands may not work correctly.\n"
               );
    }
    if ((p->pNtkCur == (Abc_Ntk_t *)0x0) || (iVar1 = Abc_FrameIsFlagEnabled("backup"), iVar1 == 0))
    {
      Abc_NtkSetBackup(pNtk,(Abc_Ntk_t *)0x0);
      iVar1 = p->nSteps + 1;
      p->nSteps = iVar1;
      Abc_NtkSetStep(pNtk,iVar1);
      if (p->pNtkCur != (Abc_Ntk_t *)0x0) {
        Abc_NtkDelete(p->pNtkCur);
      }
    }
    else {
      pNetBackup = Abc_NtkBackup(p->pNtkCur);
      Abc_NtkSetBackup(pNtk,pNetBackup);
      iVar1 = Abc_NtkStep(p->pNtkCur);
      Abc_NtkSetStep(pNtk,iVar1);
      Abc_NtkDelete(p->pNtkCur);
    }
    p->pNtkCur = pNtk;
  }
  return;
}

Assistant:

void Abc_FrameReplaceCurrentNetwork( Abc_Frame_t * p, Abc_Ntk_t * pNtk )
{
    if ( pNtk == NULL )
        return;

    if ( Abc_NtkPoNum(pNtk) == 0 )
        Abc_Print( 0, "The current network has no primary outputs. Some commands may not work correctly.\n" );

    // transfer the parameters to the new network
    if ( p->pNtkCur && Abc_FrameIsFlagEnabled( "backup" ) )
    {
        Abc_NtkSetBackup( pNtk, Abc_NtkBackup(p->pNtkCur) );
        Abc_NtkSetStep( pNtk, Abc_NtkStep(p->pNtkCur) );
        // delete the current network
        Abc_NtkDelete( p->pNtkCur );
    }
    else
    {
        Abc_NtkSetBackup( pNtk, NULL );
        Abc_NtkSetStep( pNtk, ++p->nSteps );
        // delete the current network if present but backup is disabled
        if ( p->pNtkCur )
            Abc_NtkDelete( p->pNtkCur );
    }
    // set the new current network
    p->pNtkCur = pNtk;
}